

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_init_dec_common
               (opj_mqc_t *mqc,OPJ_BYTE *bp,OPJ_UINT32 len,OPJ_UINT32 extra_writable_bytes)

{
  OPJ_UINT32 extra_writable_bytes_local;
  OPJ_UINT32 len_local;
  OPJ_BYTE *bp_local;
  opj_mqc_t *mqc_local;
  
  if (1 < extra_writable_bytes) {
    mqc->start = bp;
    mqc->end = bp + len;
    *(undefined2 *)mqc->backup = *(undefined2 *)mqc->end;
    *mqc->end = 0xff;
    mqc->end[1] = 0xff;
    mqc->bp = bp;
    return;
  }
  __assert_fail("extra_writable_bytes >= OPJ_COMMON_CBLK_DATA_EXTRA",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                ,0x1ef,
                "void opj_mqc_init_dec_common(opj_mqc_t *, OPJ_BYTE *, OPJ_UINT32, OPJ_UINT32)");
}

Assistant:

static void opj_mqc_init_dec_common(opj_mqc_t *mqc,
                                    OPJ_BYTE *bp,
                                    OPJ_UINT32 len,
                                    OPJ_UINT32 extra_writable_bytes)
{
    (void)extra_writable_bytes;

    assert(extra_writable_bytes >= OPJ_COMMON_CBLK_DATA_EXTRA);
    mqc->start = bp;
    mqc->end = bp + len;
    /* Insert an artificial 0xFF 0xFF marker at end of the code block */
    /* data so that the bytein routines stop on it. This saves us comparing */
    /* the bp and end pointers */
    /* But before inserting it, backup th bytes we will overwrite */
    memcpy(mqc->backup, mqc->end, OPJ_COMMON_CBLK_DATA_EXTRA);
    mqc->end[0] = 0xFF;
    mqc->end[1] = 0xFF;
    mqc->bp = bp;
}